

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roadmap.cpp
# Opt level: O3

bool reachedGoal(RVOSimulator *sim)

{
  size_t sVar1;
  Vector2 *pVVar2;
  size_t sVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  
  sVar1 = RVO::RVOSimulator::getNumAgents(sim);
  if (sVar1 == 0) {
    bVar4 = true;
  }
  else {
    sVar1 = 0;
    do {
      pVVar2 = RVO::RVOSimulator::getAgentPosition(sim,sVar1);
      fVar5 = pVVar2->x_ -
              roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
              super__Vector_impl_data._M_start
              [goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[sVar1]].position.x_;
      fVar6 = pVVar2->y_ -
              roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
              super__Vector_impl_data._M_start
              [goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[sVar1]].position.y_;
      fVar5 = fVar5 * fVar5 + fVar6 * fVar6;
      bVar4 = fVar5 <= 400.0;
      if (400.0 < fVar5) {
        return bVar4;
      }
      sVar1 = sVar1 + 1;
      sVar3 = RVO::RVOSimulator::getNumAgents(sim);
    } while (sVar1 < sVar3);
  }
  return bVar4;
}

Assistant:

bool reachedGoal(RVO::RVOSimulator *sim)
{
	/* Check if all agents have reached their goals. */
	for (size_t i = 0; i < sim->getNumAgents(); ++i) {
		if (RVO::absSq(sim->getAgentPosition(i) - roadmap[goals[i]].position) > 20.0f * 20.0f) {
			return false;
		}
	}

	return true;
}